

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_write_container(cram_fd *fd,cram_container *c)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  byte *pbStack_438;
  int i;
  char *cp;
  char *buf;
  char buf_a [1024];
  cram_container *c_local;
  cram_fd *fd_local;
  
  cp = (char *)&buf;
  if (0x3ff < c->num_landmarks * 5 + 0x37) {
    cp = (char *)malloc((long)(c->num_landmarks * 5 + 0x37));
  }
  if (fd->version >> 8 == 1) {
    if ((c->length & 0xffffff80U) == 0) {
      *cp = (char)c->length;
      local_440 = 1;
    }
    else {
      if ((c->length & 0xffffc000U) == 0) {
        *cp = (byte)((uint)c->length >> 8) | 0x80;
        cp[1] = (char)c->length;
        local_444 = 2;
      }
      else {
        if ((c->length & 0xffe00000U) == 0) {
          *cp = (byte)((uint)c->length >> 0x10) | 0xc0;
          cp[1] = (char)((uint)c->length >> 8);
          cp[2] = (char)c->length;
          local_448 = 3;
        }
        else {
          if ((c->length & 0xf0000000U) == 0) {
            *cp = (byte)((uint)c->length >> 0x18) | 0xe0;
            cp[1] = (char)((uint)c->length >> 0x10);
            cp[2] = (char)((uint)c->length >> 8);
            cp[3] = (char)c->length;
            local_44c = 4;
          }
          else {
            *cp = (byte)(c->length >> 0x1c) | 0xf0;
            cp[1] = (char)(c->length >> 0x14);
            cp[2] = (char)(c->length >> 0xc);
            cp[3] = (char)(c->length >> 4);
            cp[4] = (byte)c->length & 0xf;
            local_44c = 5;
          }
          local_448 = local_44c;
        }
        local_444 = local_448;
      }
      local_440 = local_444;
    }
    pbStack_438 = (byte *)(cp + local_440);
  }
  else {
    *(int32_t *)cp = c->length;
    pbStack_438 = (byte *)(cp + 4);
  }
  if (c->multi_seq == 0) {
    if ((c->ref_seq_id & 0xffffff80U) == 0) {
      *pbStack_438 = (byte)c->ref_seq_id;
      local_450 = 1;
    }
    else {
      if ((c->ref_seq_id & 0xffffc000U) == 0) {
        *pbStack_438 = (byte)((uint)c->ref_seq_id >> 8) | 0x80;
        pbStack_438[1] = (byte)c->ref_seq_id;
        local_454 = 2;
      }
      else {
        if ((c->ref_seq_id & 0xffe00000U) == 0) {
          *pbStack_438 = (byte)((uint)c->ref_seq_id >> 0x10) | 0xc0;
          pbStack_438[1] = (byte)((uint)c->ref_seq_id >> 8);
          pbStack_438[2] = (byte)c->ref_seq_id;
          local_458 = 3;
        }
        else {
          if ((c->ref_seq_id & 0xf0000000U) == 0) {
            *pbStack_438 = (byte)((uint)c->ref_seq_id >> 0x18) | 0xe0;
            pbStack_438[1] = (byte)((uint)c->ref_seq_id >> 0x10);
            pbStack_438[2] = (byte)((uint)c->ref_seq_id >> 8);
            pbStack_438[3] = (byte)c->ref_seq_id;
            local_45c = 4;
          }
          else {
            *pbStack_438 = (byte)(c->ref_seq_id >> 0x1c) | 0xf0;
            pbStack_438[1] = (byte)(c->ref_seq_id >> 0x14);
            pbStack_438[2] = (byte)(c->ref_seq_id >> 0xc);
            pbStack_438[3] = (byte)(c->ref_seq_id >> 4);
            pbStack_438[4] = (byte)c->ref_seq_id & 0xf;
            local_45c = 5;
          }
          local_458 = local_45c;
        }
        local_454 = local_458;
      }
      local_450 = local_454;
    }
    pbStack_438 = pbStack_438 + local_450;
    if ((c->ref_seq_start & 0xffffff80U) == 0) {
      *pbStack_438 = (byte)c->ref_seq_start;
      local_460 = 1;
    }
    else {
      if ((c->ref_seq_start & 0xffffc000U) == 0) {
        *pbStack_438 = (byte)((uint)c->ref_seq_start >> 8) | 0x80;
        pbStack_438[1] = (byte)c->ref_seq_start;
        local_464 = 2;
      }
      else {
        if ((c->ref_seq_start & 0xffe00000U) == 0) {
          *pbStack_438 = (byte)((uint)c->ref_seq_start >> 0x10) | 0xc0;
          pbStack_438[1] = (byte)((uint)c->ref_seq_start >> 8);
          pbStack_438[2] = (byte)c->ref_seq_start;
          local_468 = 3;
        }
        else {
          if ((c->ref_seq_start & 0xf0000000U) == 0) {
            *pbStack_438 = (byte)((uint)c->ref_seq_start >> 0x18) | 0xe0;
            pbStack_438[1] = (byte)((uint)c->ref_seq_start >> 0x10);
            pbStack_438[2] = (byte)((uint)c->ref_seq_start >> 8);
            pbStack_438[3] = (byte)c->ref_seq_start;
            local_46c = 4;
          }
          else {
            *pbStack_438 = (byte)(c->ref_seq_start >> 0x1c) | 0xf0;
            pbStack_438[1] = (byte)(c->ref_seq_start >> 0x14);
            pbStack_438[2] = (byte)(c->ref_seq_start >> 0xc);
            pbStack_438[3] = (byte)(c->ref_seq_start >> 4);
            pbStack_438[4] = (byte)c->ref_seq_start & 0xf;
            local_46c = 5;
          }
          local_468 = local_46c;
        }
        local_464 = local_468;
      }
      local_460 = local_464;
    }
    pbStack_438 = pbStack_438 + local_460;
    if ((c->ref_seq_span & 0xffffff80U) == 0) {
      *pbStack_438 = (byte)c->ref_seq_span;
      local_470 = 1;
    }
    else {
      if ((c->ref_seq_span & 0xffffc000U) == 0) {
        *pbStack_438 = (byte)((uint)c->ref_seq_span >> 8) | 0x80;
        pbStack_438[1] = (byte)c->ref_seq_span;
        local_474 = 2;
      }
      else {
        if ((c->ref_seq_span & 0xffe00000U) == 0) {
          *pbStack_438 = (byte)((uint)c->ref_seq_span >> 0x10) | 0xc0;
          pbStack_438[1] = (byte)((uint)c->ref_seq_span >> 8);
          pbStack_438[2] = (byte)c->ref_seq_span;
          local_478 = 3;
        }
        else {
          if ((c->ref_seq_span & 0xf0000000U) == 0) {
            *pbStack_438 = (byte)((uint)c->ref_seq_span >> 0x18) | 0xe0;
            pbStack_438[1] = (byte)((uint)c->ref_seq_span >> 0x10);
            pbStack_438[2] = (byte)((uint)c->ref_seq_span >> 8);
            pbStack_438[3] = (byte)c->ref_seq_span;
            local_47c = 4;
          }
          else {
            *pbStack_438 = (byte)(c->ref_seq_span >> 0x1c) | 0xf0;
            pbStack_438[1] = (byte)(c->ref_seq_span >> 0x14);
            pbStack_438[2] = (byte)(c->ref_seq_span >> 0xc);
            pbStack_438[3] = (byte)(c->ref_seq_span >> 4);
            pbStack_438[4] = (byte)c->ref_seq_span & 0xf;
            local_47c = 5;
          }
          local_478 = local_47c;
        }
        local_474 = local_478;
      }
      local_470 = local_474;
    }
    pbStack_438 = pbStack_438 + local_470;
  }
  else {
    *pbStack_438 = 0xff;
    pbStack_438[1] = 0xff;
    pbStack_438[2] = 0xff;
    pbStack_438[3] = 0xff;
    pbStack_438[4] = 0xe;
    pbStack_438[5] = 0;
    pbStack_438[6] = 0;
    pbStack_438 = pbStack_438 + 7;
  }
  if ((c->num_records & 0xffffff80U) == 0) {
    *pbStack_438 = (byte)c->num_records;
    local_480 = 1;
  }
  else {
    if ((c->num_records & 0xffffc000U) == 0) {
      *pbStack_438 = (byte)((uint)c->num_records >> 8) | 0x80;
      pbStack_438[1] = (byte)c->num_records;
      local_484 = 2;
    }
    else {
      if ((c->num_records & 0xffe00000U) == 0) {
        *pbStack_438 = (byte)((uint)c->num_records >> 0x10) | 0xc0;
        pbStack_438[1] = (byte)((uint)c->num_records >> 8);
        pbStack_438[2] = (byte)c->num_records;
        local_488 = 3;
      }
      else {
        if ((c->num_records & 0xf0000000U) == 0) {
          *pbStack_438 = (byte)((uint)c->num_records >> 0x18) | 0xe0;
          pbStack_438[1] = (byte)((uint)c->num_records >> 0x10);
          pbStack_438[2] = (byte)((uint)c->num_records >> 8);
          pbStack_438[3] = (byte)c->num_records;
          local_48c = 4;
        }
        else {
          *pbStack_438 = (byte)(c->num_records >> 0x1c) | 0xf0;
          pbStack_438[1] = (byte)(c->num_records >> 0x14);
          pbStack_438[2] = (byte)(c->num_records >> 0xc);
          pbStack_438[3] = (byte)(c->num_records >> 4);
          pbStack_438[4] = (byte)c->num_records & 0xf;
          local_48c = 5;
        }
        local_488 = local_48c;
      }
      local_484 = local_488;
    }
    local_480 = local_484;
  }
  pbStack_438 = pbStack_438 + local_480;
  if (fd->version >> 8 == 2) {
    if ((c->record_counter & 0xffffffffffffff80U) == 0) {
      *pbStack_438 = (byte)c->record_counter;
      local_490 = 1;
    }
    else {
      if ((c->record_counter & 0xffffffffffffc000U) == 0) {
        *pbStack_438 = (byte)((ulong)c->record_counter >> 8) | 0x80;
        pbStack_438[1] = (byte)c->record_counter;
        local_494 = 2;
      }
      else {
        if ((c->record_counter & 0xffffffffffe00000U) == 0) {
          *pbStack_438 = (byte)((ulong)c->record_counter >> 0x10) | 0xc0;
          pbStack_438[1] = (byte)((ulong)c->record_counter >> 8);
          pbStack_438[2] = (byte)c->record_counter;
          local_498 = 3;
        }
        else {
          if ((c->record_counter & 0xfffffffff0000000U) == 0) {
            *pbStack_438 = (byte)((ulong)c->record_counter >> 0x18) | 0xe0;
            pbStack_438[1] = (byte)((ulong)c->record_counter >> 0x10);
            pbStack_438[2] = (byte)((ulong)c->record_counter >> 8);
            pbStack_438[3] = (byte)c->record_counter;
            local_49c = 4;
          }
          else {
            *pbStack_438 = (byte)(c->record_counter >> 0x1c) | 0xf0;
            pbStack_438[1] = (byte)(c->record_counter >> 0x14);
            pbStack_438[2] = (byte)(c->record_counter >> 0xc);
            pbStack_438[3] = (byte)(c->record_counter >> 4);
            pbStack_438[4] = (byte)c->record_counter & 0xf;
            local_49c = 5;
          }
          local_498 = local_49c;
        }
        local_494 = local_498;
      }
      local_490 = local_494;
    }
    iVar1 = ltf8_put((char *)(pbStack_438 + local_490),c->num_bases);
    pbStack_438 = pbStack_438 + local_490 + iVar1;
  }
  else if (2 < fd->version >> 8) {
    iVar1 = ltf8_put((char *)pbStack_438,c->record_counter);
    iVar2 = ltf8_put((char *)(pbStack_438 + iVar1),c->num_bases);
    pbStack_438 = pbStack_438 + iVar1 + iVar2;
  }
  if ((c->num_blocks & 0xffffff80U) == 0) {
    *pbStack_438 = (byte)c->num_blocks;
    local_4a0 = 1;
  }
  else {
    if ((c->num_blocks & 0xffffc000U) == 0) {
      *pbStack_438 = (byte)((uint)c->num_blocks >> 8) | 0x80;
      pbStack_438[1] = (byte)c->num_blocks;
      local_4a4 = 2;
    }
    else {
      if ((c->num_blocks & 0xffe00000U) == 0) {
        *pbStack_438 = (byte)((uint)c->num_blocks >> 0x10) | 0xc0;
        pbStack_438[1] = (byte)((uint)c->num_blocks >> 8);
        pbStack_438[2] = (byte)c->num_blocks;
        local_4a8 = 3;
      }
      else {
        if ((c->num_blocks & 0xf0000000U) == 0) {
          *pbStack_438 = (byte)((uint)c->num_blocks >> 0x18) | 0xe0;
          pbStack_438[1] = (byte)((uint)c->num_blocks >> 0x10);
          pbStack_438[2] = (byte)((uint)c->num_blocks >> 8);
          pbStack_438[3] = (byte)c->num_blocks;
          local_4ac = 4;
        }
        else {
          *pbStack_438 = (byte)(c->num_blocks >> 0x1c) | 0xf0;
          pbStack_438[1] = (byte)(c->num_blocks >> 0x14);
          pbStack_438[2] = (byte)(c->num_blocks >> 0xc);
          pbStack_438[3] = (byte)(c->num_blocks >> 4);
          pbStack_438[4] = (byte)c->num_blocks & 0xf;
          local_4ac = 5;
        }
        local_4a8 = local_4ac;
      }
      local_4a4 = local_4a8;
    }
    local_4a0 = local_4a4;
  }
  pbStack_438 = pbStack_438 + local_4a0;
  if ((c->num_landmarks & 0xffffff80U) == 0) {
    *pbStack_438 = (byte)c->num_landmarks;
    local_4b0 = 1;
  }
  else {
    if ((c->num_landmarks & 0xffffc000U) == 0) {
      *pbStack_438 = (byte)((uint)c->num_landmarks >> 8) | 0x80;
      pbStack_438[1] = (byte)c->num_landmarks;
      local_4b4 = 2;
    }
    else {
      if ((c->num_landmarks & 0xffe00000U) == 0) {
        *pbStack_438 = (byte)((uint)c->num_landmarks >> 0x10) | 0xc0;
        pbStack_438[1] = (byte)((uint)c->num_landmarks >> 8);
        pbStack_438[2] = (byte)c->num_landmarks;
        local_4b8 = 3;
      }
      else {
        if ((c->num_landmarks & 0xf0000000U) == 0) {
          *pbStack_438 = (byte)((uint)c->num_landmarks >> 0x18) | 0xe0;
          pbStack_438[1] = (byte)((uint)c->num_landmarks >> 0x10);
          pbStack_438[2] = (byte)((uint)c->num_landmarks >> 8);
          pbStack_438[3] = (byte)c->num_landmarks;
          local_4bc = 4;
        }
        else {
          *pbStack_438 = (byte)(c->num_landmarks >> 0x1c) | 0xf0;
          pbStack_438[1] = (byte)(c->num_landmarks >> 0x14);
          pbStack_438[2] = (byte)(c->num_landmarks >> 0xc);
          pbStack_438[3] = (byte)(c->num_landmarks >> 4);
          pbStack_438[4] = (byte)c->num_landmarks & 0xf;
          local_4bc = 5;
        }
        local_4b8 = local_4bc;
      }
      local_4b4 = local_4b8;
    }
    local_4b0 = local_4b4;
  }
  pbStack_438 = pbStack_438 + local_4b0;
  for (local_43c = 0; local_43c < c->num_landmarks; local_43c = local_43c + 1) {
    if ((c->landmark[local_43c] & 0xffffff80U) == 0) {
      *pbStack_438 = (byte)c->landmark[local_43c];
      local_4c0 = 1;
    }
    else {
      if ((c->landmark[local_43c] & 0xffffc000U) == 0) {
        *pbStack_438 = (byte)((uint)c->landmark[local_43c] >> 8) | 0x80;
        pbStack_438[1] = (byte)c->landmark[local_43c];
        local_4c4 = 2;
      }
      else {
        if ((c->landmark[local_43c] & 0xffe00000U) == 0) {
          *pbStack_438 = (byte)((uint)c->landmark[local_43c] >> 0x10) | 0xc0;
          pbStack_438[1] = (byte)((uint)c->landmark[local_43c] >> 8);
          pbStack_438[2] = (byte)c->landmark[local_43c];
          local_4c8 = 3;
        }
        else {
          if ((c->landmark[local_43c] & 0xf0000000U) == 0) {
            *pbStack_438 = (byte)((uint)c->landmark[local_43c] >> 0x18) | 0xe0;
            pbStack_438[1] = (byte)((uint)c->landmark[local_43c] >> 0x10);
            pbStack_438[2] = (byte)((uint)c->landmark[local_43c] >> 8);
            pbStack_438[3] = (byte)c->landmark[local_43c];
            local_4cc = 4;
          }
          else {
            *pbStack_438 = (byte)(c->landmark[local_43c] >> 0x1c) | 0xf0;
            pbStack_438[1] = (byte)(c->landmark[local_43c] >> 0x14);
            pbStack_438[2] = (byte)(c->landmark[local_43c] >> 0xc);
            pbStack_438[3] = (byte)(c->landmark[local_43c] >> 4);
            pbStack_438[4] = (byte)c->landmark[local_43c] & 0xf;
            local_4cc = 5;
          }
          local_4c8 = local_4cc;
        }
        local_4c4 = local_4c8;
      }
      local_4c0 = local_4c4;
    }
    pbStack_438 = pbStack_438 + local_4c0;
  }
  if (2 < fd->version >> 8) {
    uVar3 = crc32(0,cp,(long)pbStack_438 - (long)cp & 0xffffffff);
    c->crc32 = uVar3;
    *pbStack_438 = (byte)c->crc32;
    pbStack_438[1] = (byte)(c->crc32 >> 8);
    pbStack_438[2] = (byte)(c->crc32 >> 0x10);
    pbStack_438[3] = (byte)(c->crc32 >> 0x18);
    pbStack_438 = pbStack_438 + 4;
  }
  sVar4 = hwrite(fd->fp,cp,(long)pbStack_438 - (long)cp);
  if ((long)pbStack_438 - (long)cp == sVar4) {
    if ((char **)cp != &buf) {
      free(cp);
    }
    fd_local._4_4_ = 0;
  }
  else {
    if ((char **)cp != &buf) {
      free(cp);
    }
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_write_container(cram_fd *fd, cram_container *c) {
    char buf_a[1024], *buf = buf_a, *cp;
    int i;

    if (55 + c->num_landmarks * 5 >= 1024)
	buf = malloc(55 + c->num_landmarks * 5);
    cp = buf;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_put(cp, c->length);
    } else {
	*(int32_t *)cp = le_int4(c->length);
	cp += 4;
    }
    if (c->multi_seq) {
	cp += itf8_put(cp, -2);
	cp += itf8_put(cp, 0);
	cp += itf8_put(cp, 0);
    } else {
	cp += itf8_put(cp, c->ref_seq_id);
	cp += itf8_put(cp, c->ref_seq_start);
	cp += itf8_put(cp, c->ref_seq_span);
    }
    cp += itf8_put(cp, c->num_records);
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	cp += itf8_put(cp, c->record_counter);
	cp += ltf8_put(cp, c->num_bases);
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_put(cp, c->record_counter);
	cp += ltf8_put(cp, c->num_bases);
    }

    cp += itf8_put(cp, c->num_blocks);
    cp += itf8_put(cp, c->num_landmarks);
    for (i = 0; i < c->num_landmarks; i++)
	cp += itf8_put(cp, c->landmark[i]);

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	c->crc32 = crc32(0L, (uc *)buf, cp-buf);
	cp[0] =  c->crc32        & 0xff;
	cp[1] = (c->crc32 >>  8) & 0xff;
	cp[2] = (c->crc32 >> 16) & 0xff;
	cp[3] = (c->crc32 >> 24) & 0xff;
	cp += 4;
    }

    if (cp-buf != hwrite(fd->fp, buf, cp-buf)) {
	if (buf != buf_a)
	    free(buf);
	return -1;
    }

    if (buf != buf_a)
	free(buf);

    return 0;
}